

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O0

void selectionsort3(float *array,int *perm,int size)

{
  float fVar1;
  int iVar2;
  int local_30;
  int local_2c;
  int best_i;
  int j;
  int i;
  int tmpi;
  float tmpf;
  int size_local;
  int *perm_local;
  float *array_local;
  
  for (best_i = 0; best_i < size + -1; best_i = best_i + 1) {
    local_30 = best_i;
    local_2c = best_i;
    while (local_2c = local_2c + 1, local_2c < size) {
      if (array[local_2c] < array[local_30]) {
        local_30 = local_2c;
      }
    }
    fVar1 = array[best_i];
    array[best_i] = array[local_30];
    array[local_30] = fVar1;
    iVar2 = perm[best_i];
    perm[best_i] = perm[local_30];
    perm[local_30] = iVar2;
  }
  return;
}

Assistant:

static inline void selectionsort3(float* array, int* perm, int size)
{
    float   tmpf;
    int     tmpi;
    int     i, j, best_i;
    for (i = 0; i < size-1; i++){
        best_i = i;
        for (j = i+1; j < size; j++){
            if (array[j] < array[best_i])
                best_i = j;
        }
        tmpf = array[i]; array[i] = array[best_i]; array[best_i] = tmpf;
        tmpi = perm[i];  perm[i]  = perm[best_i];  perm[best_i]  = tmpi;
    }
}